

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O1

bool __thiscall
QDirListingPrivate::matchesFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QRegularExpression *pQVar1;
  uint uVar2;
  long lVar3;
  QRegularExpression *pQVar4;
  bool bVar5;
  const_iterator cVar6;
  long in_FS_OFFSET;
  QStringView fileName;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName(&local_38,entryInfo);
  if (local_38.d.size != 0) {
    fileName.m_data = local_38.d.ptr;
    fileName.m_size = local_38.d.size;
    bVar5 = isDotOrDotDot(fileName);
    if (bVar5) {
      bVar5 = (bool)((byte)(this->iteratorFlags).
                           super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                           super_QFlagsStorage<QDirListing::IteratorFlag>.i >> 7);
      goto LAB_002311ee;
    }
    lVar3 = (this->nameRegExps).d.size;
    if (((lVar3 == 0) ||
        (pQVar4 = (this->nameRegExps).d.ptr, pQVar1 = pQVar4 + lVar3,
        cVar6 = std::
                __find_if<QList<QRegularExpression>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QDirListingPrivate::regexMatchesName(QString_const&)const::_lambda(auto:1_const&)_1_>>
                          (pQVar4,pQVar1,&local_38), cVar6.i != pQVar1)) &&
       ((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x40) != 0 ||
        (bVar5 = QDirEntryInfo::isHidden(entryInfo), !bVar5)))) {
      bVar5 = QDirEntryInfo::isSymLink(entryInfo);
      if (bVar5) {
        uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                super_QFlagsStorage<QDirListing::IteratorFlag>.i;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 0x1c) == 0) goto LAB_00231192;
        }
        else {
          bVar5 = QDirEntryInfo::exists(entryInfo);
          if (bVar5) goto LAB_00231192;
        }
      }
      else {
LAB_00231192:
        if ((((((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                  super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x10) == 0) ||
               (bVar5 = QDirEntryInfo::isFile(entryInfo), bVar5)) ||
              (bVar5 = QDirEntryInfo::isDir(entryInfo), bVar5)) ||
             (bVar5 = QDirEntryInfo::isSymLink(entryInfo), bVar5)) &&
            ((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
               super_QFlagsStorage<QDirListing::IteratorFlag>.i & 8) == 0 ||
             (bVar5 = QDirEntryInfo::isDir(entryInfo), !bVar5)))) &&
           ((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
              super_QFlagsStorage<QDirListing::IteratorFlag>.i & 4) == 0 ||
            (bVar5 = QDirEntryInfo::isFile(entryInfo), !bVar5)))) {
          bVar5 = true;
          goto LAB_002311ee;
        }
      }
    }
  }
  bVar5 = false;
LAB_002311ee:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QDirListingPrivate::matchesFilters(QDirEntryInfo &entryInfo) const
{
    using F = QDirListing::IteratorFlag;

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    if (isDotOrDotDot(fileName)) // All done, other checks below don't matter in this case
        return iteratorFlags.testAnyFlags(F::IncludeDotAndDotDot);

    // name filter
#if QT_CONFIG(regularexpression)
    if (!regexMatchesName(fileName))
        return false;
#endif // QT_CONFIG(regularexpression)

    if (!iteratorFlags.testAnyFlag(F::IncludeHidden) && entryInfo.isHidden())
        return false;

    if (entryInfo.isSymLink()) {
        // With ResolveSymlinks, we look at the type of the link's target,
        // and exclude broken symlinks (where the target doesn't exist).
        if (iteratorFlags.testAnyFlag(F::ResolveSymlinks)) {
            if (!entryInfo.exists())
                return false;
        } else if (iteratorFlags.testAnyFlags(F::FilesOnly)
                   || iteratorFlags.testAnyFlags(F::DirsOnly)) {
            return false; // symlink is not a file or dir
        }
    }

    if (iteratorFlags.testAnyFlag(F::ExcludeOther)
        && !entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink()) {
        return false;
    }

    if (iteratorFlags.testAnyFlags(F::ExcludeDirs) && entryInfo.isDir())
        return false;

    if (iteratorFlags.testAnyFlags(F::ExcludeFiles) && entryInfo.isFile())
        return false;

    return true;
}